

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageUtil.cpp
# Opt level: O3

void __thiscall
vkt::pipeline::TestTextureCubeArray::TestTextureCubeArray
          (TestTextureCubeArray *this,TextureFormat *format,int size,int arraySize)

{
  TextureCubeArray *this_00;
  TestTexture *this_01;
  vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> local_30;
  
  (this->super_TestTexture).m_compressedLevels.
  super__Vector_base<tcu::CompressedTexture_*,_std::allocator<tcu::CompressedTexture_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_TestTexture).m_compressedLevels.
  super__Vector_base<tcu::CompressedTexture_*,_std::allocator<tcu::CompressedTexture_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_TestTexture).m_compressedLevels.
  super__Vector_base<tcu::CompressedTexture_*,_std::allocator<tcu::CompressedTexture_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_TestTexture)._vptr_TestTexture = (_func_int **)&PTR__TestTextureCubeArray_00cf2e88;
  this_00 = &this->m_texture;
  tcu::TextureCubeArray::TextureCubeArray(this_00,format,size,arraySize);
  allocateLevels<tcu::TextureCubeArray>(this_00);
  this_01 = (TestTexture *)&local_30;
  getLevelsVector<tcu::TextureCubeArray>
            ((vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> *)this_01,
             this_00);
  TestTexture::populateLevels(this_01,&local_30);
  if (local_30.super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.
                    super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_30.
                          super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.
                          super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TestTextureCubeArray::TestTextureCubeArray (const tcu::TextureFormat& format, int size, int arraySize)
	: TestTexture	(format, size, size, arraySize)
	, m_texture		(format, size, arraySize)
{
	allocateLevels(m_texture);
	TestTexture::populateLevels(getLevelsVector(m_texture));
}